

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  xmlNs *pxVar3;
  _xmlAttr *p_Var4;
  int iVar5;
  int iVar6;
  
  if ((((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) &&
      (reader->curnode == (xmlNodePtr)0x0)) && (pxVar1->type == XML_ELEMENT_NODE)) {
    pxVar3 = (xmlNs *)&pxVar1->nsDef;
    iVar5 = -1;
    do {
      iVar5 = iVar5 + 1;
      pxVar3 = pxVar3->next;
      if (no <= iVar5) break;
    } while (pxVar3 != (xmlNs *)0x0);
    if (pxVar3 != (xmlNs *)0x0) {
      pxVar2 = readerStrdup(reader,pxVar3->href);
      return pxVar2;
    }
    p_Var4 = pxVar1->properties;
    if (p_Var4 != (_xmlAttr *)0x0) {
      iVar6 = no - iVar5;
      if (iVar6 != 0 && iVar5 <= no) {
        do {
          p_Var4 = p_Var4->next;
          if (p_Var4 == (_xmlAttr *)0x0) {
            return (xmlChar *)0x0;
          }
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      if (p_Var4->children != (xmlNode *)0x0) {
        pxVar2 = xmlNodeListGetString(pxVar1->doc,p_Var4->children,1);
        if (pxVar2 == (xmlChar *)0x0) {
          xmlTextReaderErrMemory(reader);
          return (xmlChar *)0x0;
        }
        return pxVar2;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader, int no) {
    xmlChar *ret;
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL)
	return(readerStrdup(reader, ns->href));

    cur = reader->node->properties;
    if (cur == NULL)
	return(NULL);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(NULL);
    }
    /* TODO walk the DTD if present */

    if (cur->children == NULL)
        return(NULL);
    ret = xmlNodeListGetString(reader->node->doc, cur->children, 1);
    if (ret == NULL)
        xmlTextReaderErrMemory(reader);
    return(ret);
}